

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::JitAllocator::shrink(JitAllocator *this,Span *span,size_t newSize)

{
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool in_stack_0000000f;
  size_t in_stack_00000010;
  Span *in_stack_00000018;
  JitAllocatorPrivateImpl *in_stack_00000020;
  Error err;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  Error local_34;
  long *local_28;
  Error local_14;
  
  if ((undefined1 *)*in_RDI == JitAllocatorImpl_none) {
    local_14 = DebugUtils::errored(5);
  }
  else if (*in_RSI == 0) {
    local_14 = DebugUtils::errored(2);
  }
  else if (in_RDX == 0) {
    local_28 = in_RSI;
    local_34 = release((JitAllocator *)in_stack_00000020,in_stack_00000018);
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_3c = 0;
    memcpy(local_28,&local_60,0x28);
    local_14 = local_34;
  }
  else {
    local_14 = JitAllocatorImpl_shrink
                         (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
  }
  return local_14;
}

Assistant:

Error JitAllocator::shrink(Span& span, size_t newSize) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!span.rx()))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(newSize == 0)) {
    Error err = release(span.rx());
    span = Span{};
    return err;
  }

  return JitAllocatorImpl_shrink(static_cast<JitAllocatorPrivateImpl*>(_impl), span, newSize, false);
}